

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall
kratos::GeneratorConnectivityVisitor::visit(GeneratorConnectivityVisitor *this,Generator *generator)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  iterator iVar4;
  StmtException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  uint uVar5;
  long *plVar6;
  basic_string_view<char> bVar7;
  string_view format_str;
  format_args args;
  string local_128;
  AssignStmt *local_108;
  undefined8 uStack_100;
  undefined1 local_e8 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  bits;
  const_iterator local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  _Base_ptr local_80;
  _Base_ptr local_78;
  Generator *local_70;
  Stmt **ppSStack_68;
  vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> stmt_list;
  element_type *local_48;
  uint local_34;
  
  if ((((generator->lib_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (generator->lib_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) && ((generator->is_external_ & 1U) == 0)) &&
     (generator->is_stub_ == false)) {
    local_78 = &(generator->ports_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_70 = generator;
    stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this;
    for (local_80 = (generator->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_80 != local_78; local_80 = (_Base_ptr)std::_Rb_tree_increment(local_80)) {
      Generator::get_port((Generator *)&stack0xffffffffffffffb8,(string *)local_70);
      if ((local_48->direction_ != In) ||
         (*(char *)(stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 9) == '\0')) {
        local_e8 = (undefined1  [8])&bits._M_h._M_rehash_policy._M_next_resize;
        bits._M_h._M_buckets = (__buckets_ptr)0x1;
        bits._M_h._M_bucket_count = 0;
        bits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        bits._M_h._M_element_count._0_4_ = 0x3f800000;
        bits._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        bits._M_h._M_rehash_policy._4_4_ = 0;
        bits._M_h._M_rehash_policy._M_next_resize = 0;
        bVar1 = connected((shared_ptr<kratos::Port> *)&stack0xffffffffffffffb8,
                          (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)local_e8);
        if (!bVar1) {
          stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ppSStack_68 = (Stmt **)0x0;
          stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          iVar2 = (*(local_48->super_Var).super_IRNode._vptr_IRNode[0x10])();
          plVar6 = (long *)(CONCAT44(extraout_var,iVar2) + 0x10);
          while (plVar6 = (long *)*plVar6, plVar6 != (long *)0x0) {
            local_a8._M_current = (Stmt **)plVar6[1];
            std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::
            emplace_back<kratos::AssignStmt*>
                      ((vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)&ppSStack_68,
                       (AssignStmt **)&local_a8);
          }
          uVar5 = 0;
          while( true ) {
            local_34 = uVar5;
            uVar3 = (*(local_48->super_Var).super_IRNode._vptr_IRNode[7])();
            if (uVar3 <= uVar5) break;
            iVar4 = std::
                    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)local_e8,&stack0xffffffffffffffcc);
            if (iVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
              this_00 = (StmtException *)__cxa_allocate_exception(0x10);
              (*(local_48->super_Var).super_IRNode._vptr_IRNode[0x20])(&local_108);
              local_98 = (ulong)local_34;
              local_a8._M_current = (Stmt **)local_108;
              uStack_a0 = uStack_100;
              bVar7 = fmt::v7::to_string_view<char,_0>
                                ("{0}[{1}] is a floating net. Please check your connections");
              format_str.data_ = (char *)bVar7.size_;
              format_str.size_ = 0x2d;
              args.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.args_ = in_R9.args_;
              args.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = (unsigned_long_long)&local_a8;
              fmt::v7::detail::vformat_abi_cxx11_(&local_128,(detail *)bVar7.data_,format_str,args);
              local_a8._M_current = ppSStack_68;
              bits._M_h._M_single_bucket =
                   (__node_base_ptr)
                   stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              StmtException::StmtException
                        (this_00,&local_128,&local_a8,(const_iterator *)&bits._M_h._M_single_bucket)
              ;
              __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar5 = local_34 + 1;
          }
          std::_Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::~_Vector_base
                    ((_Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)&ppSStack_68);
        }
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_e8);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
    }
    *(undefined1 *)
     (stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage + 9) = 0;
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        // skip if it's an external module or stub module
        if (generator->external() || generator->is_stub()) return;
        const auto& port_names = generator->get_port_names();
        for (const auto& port_name : port_names) {
            auto const& port = generator->get_port(port_name);

            // based on whether it's an input or output
            // for inputs, if it's not top generator, we need to check if
            // something is driving it
            if (port->port_direction() == PortDirection::In) {
                if (is_top_level_) continue;
            }

            std::unordered_set<uint32_t> bits;
            bool has_error = !connected(port, bits);

            if (has_error) {
                std::vector<Stmt*> stmt_list;
                for (auto const& stmt : port->sources()) {
                    stmt_list.emplace_back(stmt.get());
                }
                for (uint32_t i = 0; i < port->width(); i++) {
                    if (bits.find(i) == bits.end()) {
                        throw StmtException(
                            ::format("{0}[{1}] is a floating net. Please check your connections",
                                     port->handle_name(), i),
                            stmt_list.begin(), stmt_list.end());
                    }
                }
            }
        }

        is_top_level_ = false;
    }